

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_time.h
# Opt level: O0

void stm_setup(void)

{
  undefined1 local_18 [8];
  timespec ts;
  
  memset(&_stm,0,0x10);
  _stm.initialized = 0xabcdabcd;
  clock_gettime(1,(timespec *)local_18);
  _stm.start = (long)local_18 * 1000000000 + ts.tv_sec;
  return;
}

Assistant:

SOKOL_API_IMPL void stm_setup(void) {
    memset(&_stm, 0, sizeof(_stm));
    _stm.initialized = 0xABCDABCD;
    #if defined(_WIN32)
        QueryPerformanceFrequency(&_stm.freq);
        QueryPerformanceCounter(&_stm.start);
    #elif defined(__APPLE__) && defined(__MACH__)
        mach_timebase_info(&_stm.timebase);
        _stm.start = mach_absolute_time();
    #elif defined(__EMSCRIPTEN__)
        _stm.start = stm_js_perfnow();
    #else
        struct timespec ts;
        clock_gettime(CLOCK_MONOTONIC, &ts);
        _stm.start = (uint64_t)ts.tv_sec*1000000000 + (uint64_t)ts.tv_nsec;
    #endif
}